

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_window.c
# Opt level: O3

void applySizeLimits(_GLFWwindow *window,int *width,int *height)

{
  int iVar1;
  
  if ((window->numer != -1) && (window->denom != -1)) {
    *height = (int)((float)*width / ((float)window->numer / (float)window->denom));
  }
  iVar1 = window->minwidth;
  if (((iVar1 != -1) && (*width < iVar1)) ||
     ((iVar1 = window->maxwidth, iVar1 != -1 && (iVar1 < *width)))) {
    *width = iVar1;
  }
  iVar1 = window->minheight;
  if (((iVar1 != -1) && (*height < iVar1)) ||
     ((iVar1 = window->maxheight, iVar1 != -1 && (iVar1 < *height)))) {
    *height = iVar1;
  }
  return;
}

Assistant:

static void applySizeLimits(_GLFWwindow* window, int* width, int* height)
{
    if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
    {
        const float ratio = (float) window->numer / (float) window->denom;
        *height = (int) (*width / ratio);
    }

    if (window->minwidth != GLFW_DONT_CARE && *width < window->minwidth)
        *width = window->minwidth;
    else if (window->maxwidth != GLFW_DONT_CARE && *width > window->maxwidth)
        *width = window->maxwidth;

    if (window->minheight != GLFW_DONT_CARE && *height < window->minheight)
        *height = window->minheight;
    else if (window->maxheight != GLFW_DONT_CARE && *height > window->maxheight)
        *height = window->maxheight;
}